

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::udp_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,udp_error_alert *this)

{
  char *__rhs;
  address local_108;
  string local_e8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  udp_error_alert *local_18;
  udp_error_alert *this_local;
  
  local_18 = this;
  this_local = (udp_error_alert *)__return_storage_ptr__;
  boost::system::error_code::message_abi_cxx11_(&local_b8,&this->error);
  ::std::operator+(&local_98,"UDP error: ",&local_b8);
  ::std::operator+(&local_78,&local_98," from: ");
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
            (&local_108,&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>);
  boost::asio::ip::address::to_string_abi_cxx11_(&local_e8,&local_108);
  ::std::operator+(&local_58,&local_78,&local_e8);
  ::std::operator+(&local_38,&local_58," op: ");
  __rhs = operation_name(this->operation);
  ::std::operator+(__return_storage_ptr__,&local_38,__rhs);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_e8);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string udp_error_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		return "UDP error: " + error.message()
			+ " from: " + endpoint.address().to_string()
			+ " op: " + operation_name(operation);
#endif
	}